

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O0

NaReal ask_user_real(char *szPrompt,NaReal fDefault)

{
  undefined8 in_RDI;
  double in_XMM0_Qa;
  char enter [30];
  char local_38 [32];
  double local_18;
  undefined8 local_10;
  double local_8;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RDI;
  memset(local_38,0,0x1e);
  printf("%s <%g>: ",local_18,local_10);
  fgets(local_38,0x1d,_stdin);
  if ((local_38[0] == '\0') || (local_38[0] == '\n')) {
    local_8 = local_18;
  }
  else {
    local_8 = strtod(local_38,(char **)0x0);
  }
  return local_8;
}

Assistant:

NaReal
ask_user_real (const char* szPrompt, NaReal fDefault)
{
    char    enter[30] = "";
    printf("%s <%g>: ", szPrompt, fDefault);
    fgets(enter, sizeof(enter)-1, stdin);
    if('\0' == enter[0] || '\n' == enter[0])
        return fDefault;
    return strtod(enter, NULL);
}